

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *old)

{
  pair<QModelIndex,_QPersistentModelIndex> *ppVar1;
  Data *pDVar2;
  QPersistentModelIndexData *pQVar3;
  undefined1 *puVar4;
  quintptr qVar5;
  int iVar6;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar7;
  pair<QModelIndex,_QPersistentModelIndex> *data;
  long lVar8;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar9;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0 &&
         where == GrowsAtEnd) && (pDVar2 = this->d, pDVar2 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QtPrivate::QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::reallocate
                ((QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 5),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (pair<QModelIndex,_QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    ppVar7 = local_48.ptr;
    if (local_48.ptr == (pair<QModelIndex,_QPersistentModelIndex> *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar8 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) ||
            (old != (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar8) {
            ppVar10 = this->ptr;
            ppVar9 = ppVar10 + lVar8;
            do {
              ppVar7[local_48.size].first.m.ptr = (ppVar10->first).m.ptr;
              iVar6 = (ppVar10->first).c;
              qVar5 = (ppVar10->first).i;
              ppVar1 = ppVar7 + local_48.size;
              (ppVar1->first).r = (ppVar10->first).r;
              (ppVar1->first).c = iVar6;
              (ppVar1->first).i = qVar5;
              QPersistentModelIndex::QPersistentModelIndex
                        (&ppVar7[local_48.size].second,&ppVar10->second);
              local_48.size = local_48.size + 1;
              ppVar10 = ppVar10 + 1;
            } while (ppVar10 < ppVar9);
          }
        }
        else if (0 < lVar8) {
          ppVar7 = this->ptr;
          ppVar10 = ppVar7 + lVar8;
          do {
            local_48.ptr[local_48.size].first.m.ptr = (ppVar7->first).m.ptr;
            iVar6 = (ppVar7->first).c;
            qVar5 = (ppVar7->first).i;
            ppVar9 = local_48.ptr + local_48.size;
            (ppVar9->first).r = (ppVar7->first).r;
            (ppVar9->first).c = iVar6;
            (ppVar9->first).i = qVar5;
            pQVar3 = (ppVar7->second).d;
            (ppVar7->second).d = (QPersistentModelIndexData *)0x0;
            local_48.ptr[local_48.size].second.d = pQVar3;
            ppVar7 = ppVar7 + 1;
            local_48.size = local_48.size + 1;
          } while (ppVar7 < ppVar10);
        }
      }
      pDVar2 = this->d;
      ppVar7 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar4 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = ppVar7;
      local_48.size = (qsizetype)puVar4;
      if (old != (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar2;
        old->ptr = ppVar7;
        local_48.size = old->size;
        old->size = (qsizetype)puVar4;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }